

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O3

void jpeg_set_marker_processor
               (j_decompress_ptr cinfo,int marker_code,jpeg_marker_parser_method routine)

{
  jpeg_error_mgr *pjVar1;
  
  if (marker_code == 0xfe) {
    cinfo->marker[1].reset_marker_reader = (_func_void_j_decompress_ptr *)routine;
    return;
  }
  if ((marker_code & 0xfffffff0U) == 0xe0) {
    (&cinfo->marker[1].read_markers)[marker_code - 0xe0] = (_func_int_j_decompress_ptr *)routine;
    return;
  }
  pjVar1 = cinfo->err;
  pjVar1->msg_code = 0x44;
  (pjVar1->msg_parm).i[0] = marker_code;
  (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  return;
}

Assistant:

GLOBAL(void)
jpeg_set_marker_processor(j_decompress_ptr cinfo, int marker_code,
                          jpeg_marker_parser_method routine)
{
  my_marker_ptr marker = (my_marker_ptr)cinfo->marker;

  if (marker_code == (int)M_COM)
    marker->process_COM = routine;
  else if (marker_code >= (int)M_APP0 && marker_code <= (int)M_APP15)
    marker->process_APPn[marker_code - (int)M_APP0] = routine;
  else
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, marker_code);
}